

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es31fShaderImageLoadStoreTests.cpp
# Opt level: O2

IterateResult __thiscall
deqp::gles31::Functional::anon_unknown_1::ImageLoadAndStoreCase::iterate
          (ImageLoadAndStoreCase *this)

{
  ostringstream *poVar1;
  ushort uVar2;
  TextureType TVar3;
  ChannelType CVar4;
  uint uVar5;
  RenderContext *pRVar6;
  pointer log;
  bool bVar7;
  long lVar8;
  int iVar9;
  int iVar10;
  deUint32 dVar11;
  deUint32 format;
  ContextType type;
  GLSLVersion version;
  int iVar12;
  undefined4 extraout_var;
  char *pcVar13;
  ProgramSources *sources;
  int extraout_var_00;
  undefined4 extraout_var_01;
  undefined4 extraout_var_02;
  undefined4 extraout_var_03;
  undefined4 extraout_var_04;
  undefined4 extraout_var_05;
  undefined4 extraout_var_06;
  int iVar14;
  IVec3 *imageSize_00;
  ulong uVar15;
  ulong uVar16;
  TextureFormat *format_00;
  int x_3;
  void *__src;
  int layerNdx;
  CubeFace CVar17;
  int iVar18;
  ImageLoadAndStoreCase *pIVar19;
  TextureFormat *pTVar20;
  int y_1;
  long lVar21;
  int x_1;
  long lVar22;
  int y;
  CubeFace CVar23;
  int z;
  ChannelType CVar24;
  Functional *this_00;
  int x;
  CubeFace x_00;
  bool *__rhs;
  bool bVar25;
  bool bVar26;
  undefined4 uVar27;
  float local_770;
  IVec3 local_764;
  RenderContext *local_758;
  ulong local_750;
  ImageLoadAndStoreCase *local_748;
  deUint32 local_740;
  CubeFace local_73c;
  TextureFormat *local_738;
  CubeFace local_730;
  int local_72c;
  long local_728;
  CallLogWrapper glLog;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_6f0;
  string local_6d0;
  TextureLevel scratch;
  Texture texture1;
  Texture texture0;
  PixelBufferAccess scratchAccess;
  Buffer texture1Buf;
  int local_5f4;
  int local_5f0;
  int local_5ec;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_5e8;
  Buffer texture0Buf;
  PixelBufferAccess sliceAccess_1;
  undefined1 local_588 [32];
  string shaderImageTypeStr;
  LayeredImage reference;
  string shaderImageFormatStr;
  string local_4c0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_4a0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_480;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_460;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_440;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_420;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_400;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_3e0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_3c0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_3a0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_380;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_360;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_340;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_320;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_300;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_2e0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_2c0;
  string glslVersionDeclaration;
  IVec3 imageSize;
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>_>
  local_268 [3];
  pointer local_1d0;
  undefined1 uStack_1c8;
  undefined7 uStack_1c7;
  undefined1 uStack_1c0;
  undefined8 uStack_1bf;
  IVec4 color;
  int local_198;
  pointer local_190;
  GLuint local_118;
  bool local_f0;
  
  pRVar6 = ((this->super_TestCase).m_context)->m_renderCtx;
  log = (pointer)((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx)->m_log;
  iVar10 = (*pRVar6->_vptr_RenderContext[3])(pRVar6);
  glu::CallLogWrapper::CallLogWrapper
            (&glLog,(Functions *)CONCAT44(extraout_var,iVar10),(TestLog *)log);
  dVar11 = glu::getInternalFormat(this->m_textureFormat);
  format = glu::getInternalFormat(this->m_imageFormat);
  TVar3 = this->m_textureType;
  local_740 = getGLTextureTarget(TVar3);
  defaultImageSize((Functional *)&local_764,TVar3);
  CVar17 = local_764.m_data[1];
  if (local_764.m_data[1] <= local_764.m_data[2]) {
    CVar17 = local_764.m_data[2];
  }
  if ((int)CVar17 < local_764.m_data[0]) {
    CVar17 = local_764.m_data[0];
  }
  CVar24 = (this->m_textureFormat).type;
  if ((CVar24 < UNORM_BYTE_44) && ((0x58U >> (CVar24 & UNSIGNED_INT16) & 1) != 0)) {
    local_770 = 1.0;
LAB_0125409e:
    local_770 = local_770 / (float)(int)(CVar17 - CUBEFACE_POSITIVE_X);
  }
  else {
    if (CVar24 < UNORM_INT8) {
      local_770 = 2.0;
      goto LAB_0125409e;
    }
    local_770 = 1.0;
  }
  if (CVar24 < UNORM_INT8) {
    uVar27 = 0xbf800000;
  }
  else {
    uVar27 = 0;
  }
  local_750 = CONCAT44(local_750._4_4_,uVar27);
  CVar17 = local_764.m_data[2];
  if (this->m_textureType == TEXTURETYPE_CUBE) {
    CVar17 = CUBEFACE_LAST;
  }
  if ((UNSIGNED_INT32 < CVar24) ||
     (bVar25 = true, (0x2c0000000U >> ((ulong)CVar24 & 0x3f) & 1) == 0)) {
    bVar25 = CVar24 - SIGNED_INT8 < 3;
  }
  glu::TypedObjectWrapper<(glu::ObjectType)1>::TypedObjectWrapper(&texture0Buf,pRVar6);
  glu::TypedObjectWrapper<(glu::ObjectType)1>::TypedObjectWrapper(&texture1Buf,pRVar6);
  glu::TypedObjectWrapper<(glu::ObjectType)0>::TypedObjectWrapper(&texture0,pRVar6);
  glu::TypedObjectWrapper<(glu::ObjectType)0>::TypedObjectWrapper(&texture1,pRVar6);
  LayeredImage::LayeredImage
            (&reference,this->m_textureType,&this->m_textureFormat,local_764.m_data[0],
             local_764.m_data[1],local_764.m_data[2]);
  glLog.m_enableLog = true;
  poVar1 = (ostringstream *)(color.m_data + 2);
  color.m_data._0_8_ = log;
  std::__cxx11::ostringstream::ostringstream(poVar1);
  std::operator<<((ostream *)poVar1,"// Created 2 textures (names ");
  std::ostream::_M_insert<unsigned_long>((ulong)poVar1);
  std::operator<<((ostream *)poVar1," and ");
  std::ostream::_M_insert<unsigned_long>((ulong)poVar1);
  std::operator<<((ostream *)poVar1,")");
  tcu::MessageBuilder::operator<<
            ((MessageBuilder *)&color,(EndMessageToken *)&tcu::TestLog::EndMessage);
  local_730 = CVar17;
  std::__cxx11::ostringstream::~ostringstream(poVar1);
  if (this->m_textureType == TEXTURETYPE_BUFFER) {
    poVar1 = (ostringstream *)(color.m_data + 2);
    color.m_data._0_8_ = log;
    std::__cxx11::ostringstream::ostringstream(poVar1);
    std::operator<<((ostream *)poVar1,"// Created buffers for the textures (names ");
    std::ostream::_M_insert<unsigned_long>((ulong)poVar1);
    std::operator<<((ostream *)poVar1," and ");
    std::ostream::_M_insert<unsigned_long>((ulong)poVar1);
    std::operator<<((ostream *)poVar1,")");
    tcu::MessageBuilder::operator<<
              ((MessageBuilder *)&color,(EndMessageToken *)&tcu::TestLog::EndMessage);
    std::__cxx11::ostringstream::~ostringstream(poVar1);
  }
  pTVar20 = &this->m_imageFormat;
  CVar17 = CUBEFACE_NEGATIVE_X;
  local_73c = CUBEFACE_NEGATIVE_X;
  local_758 = pRVar6;
  local_748 = this;
  local_738 = pTVar20;
  if (0 < (int)local_730) {
    local_73c = local_730;
  }
  for (; pIVar19 = local_748, CVar17 != local_73c; CVar17 = CVar17 + CUBEFACE_POSITIVE_X) {
    for (CVar23 = CUBEFACE_NEGATIVE_X; (int)CVar23 < local_764.m_data[1];
        CVar23 = CVar23 + CUBEFACE_POSITIVE_X) {
      iVar10 = -1;
      for (x_00 = CUBEFACE_NEGATIVE_X; (int)x_00 < local_764.m_data[0];
          x_00 = x_00 + CUBEFACE_POSITIVE_X) {
        color.m_data[2] = x_00 ^ CVar17 ^ local_764.m_data[1] + ~CVar23;
        color.m_data[3] = local_764.m_data[0] + iVar10 ^ CVar17 ^ local_764.m_data[1] + ~CVar23;
        color.m_data[1] = CVar23 ^ CVar17 ^ local_764.m_data[0] + iVar10;
        color.m_data[0] = CVar23 ^ CVar17 ^ x_00;
        if (bVar25) {
          Functional::(anonymous_namespace)::LayeredImage::setPixel<tcu::Vector<int,4>>
                    ((LayeredImage *)&reference,x_00,CVar23,CVar17,&color);
        }
        else {
          tcu::Vector<int,_4>::cast<float>((Vector<int,_4> *)&scratchAccess);
          tcu::operator*((tcu *)&scratch,local_770,(Vector<float,_4> *)&scratchAccess);
          tcu::operator+((tcu *)&imageSize,(float)local_750,(Vector<float,_4> *)&scratch);
          Functional::(anonymous_namespace)::LayeredImage::setPixel<tcu::Vector<float,4>>
                    ((LayeredImage *)&reference,x_00,CVar23,CVar17,(Vector<float,_4> *)&imageSize);
        }
        iVar10 = iVar10 + -1;
      }
      pTVar20 = local_738;
    }
  }
  CVar24 = (local_748->m_textureFormat).type;
  CVar4 = (local_748->m_imageFormat).type;
  if (CVar24 == HALF_FLOAT || CVar4 != HALF_FLOAT) {
    if (CVar24 != FLOAT && CVar4 == FLOAT) {
      iVar10 = tcu::TextureFormat::getPixelSize(local_738);
      iVar12 = (uint)(local_738->order == RGBA) << 2;
      if (local_738->order == R) {
        iVar12 = 1;
      }
      tcu::Vector<int,_3>::Vector(&imageSize,&reference.m_size);
      uVar16 = 0;
      uVar15 = (ulong)(uint)imageSize.m_data[2];
      if (imageSize.m_data[2] < 1) {
        uVar15 = uVar16;
      }
      uVar27 = (undefined4)uVar15;
      if (reference.m_type == TEXTURETYPE_CUBE) {
        uVar27 = 6;
      }
      local_728 = CONCAT44(local_728._4_4_,uVar27);
      while( true ) {
        CVar17 = (CubeFace)uVar16;
        if (CVar17 == (CubeFace)local_728) break;
        local_750 = uVar16;
        if (reference.m_type == TEXTURETYPE_CUBE) {
          LayeredImage::getCubeFaceAccessInternal((PixelBufferAccess *)&color,&reference,CVar17);
        }
        else {
          LayeredImage::getSliceAccessInternal((PixelBufferAccess *)&color,&reference,CVar17);
        }
        for (lVar21 = 0; lVar21 < imageSize.m_data[1]; lVar21 = lVar21 + 1) {
          for (lVar22 = 0; lVar22 < imageSize.m_data[0]; lVar22 = lVar22 + 1) {
            lVar8 = (long)(iVar10 * (int)lVar22) + (long)(local_198 * (int)lVar21);
            iVar14 = 0;
            iVar18 = iVar12;
            while (bVar26 = iVar18 != 0, iVar18 = iVar18 + -1, bVar26) {
              uVar5 = *(uint *)((long)local_190 + iVar14 / iVar12 + lVar8);
              if (((uVar5 & 0x7fffffff) == 0x7f800000) ||
                 ((uVar5 & 0x7fffff) != 0 &&
                  ((uVar5 & 0x7f800000) == 0 || (uVar5 & 0x7f800000) == 0x7f800000))) {
                *(undefined4 *)((long)local_190 + iVar14 / iVar12 + lVar8) = 0;
              }
              iVar14 = iVar14 + iVar10;
            }
            pIVar19 = local_748;
          }
        }
        uVar16 = (ulong)((int)local_750 + 1);
      }
    }
  }
  else {
    iVar10 = tcu::TextureFormat::getPixelSize(pTVar20);
    iVar12 = (uint)(local_738->order == RGBA) << 2;
    if (local_738->order == R) {
      iVar12 = 1;
    }
    tcu::Vector<int,_3>::Vector(&imageSize,&reference.m_size);
    CVar17 = imageSize.m_data[2];
    if (imageSize.m_data[2] < 1) {
      CVar17 = CUBEFACE_NEGATIVE_X;
    }
    if (reference.m_type == TEXTURETYPE_CUBE) {
      CVar17 = CUBEFACE_LAST;
    }
    for (CVar23 = CUBEFACE_NEGATIVE_X; pIVar19 = local_748, CVar23 != CVar17;
        CVar23 = CVar23 + CUBEFACE_POSITIVE_X) {
      if (reference.m_type == TEXTURETYPE_CUBE) {
        LayeredImage::getCubeFaceAccessInternal((PixelBufferAccess *)&color,&reference,CVar23);
      }
      else {
        LayeredImage::getSliceAccessInternal((PixelBufferAccess *)&color,&reference,CVar23);
      }
      local_72c = local_198;
      for (lVar21 = 0; lVar21 < imageSize.m_data[1]; lVar21 = lVar21 + 1) {
        local_728 = (long)(local_72c * (int)lVar21) + (long)local_190;
        uVar15 = 0;
        while ((long)uVar15 < (long)imageSize.m_data[0]) {
          lVar22 = iVar10 * (int)uVar15 + local_728;
          iVar14 = 0;
          local_750 = uVar15;
          iVar18 = iVar12;
          while (bVar26 = iVar18 != 0, iVar18 = iVar18 + -1, bVar26) {
            uVar2 = *(ushort *)(lVar22 + iVar14 / iVar12);
            if (((uVar2 & 0x7fff) == 0x7c00) ||
               ((uVar2 & 0x3ff) != 0 && ((uVar2 & 0x7c00) == 0 || (uVar2 & 0x7c00) == 0x7c00))) {
              tcu::Float<unsigned_short,_5,_10,_15,_3U>::Float
                        ((Float<unsigned_short,_5,_10,_15,_3U> *)&scratch,0.0);
              *(undefined2 *)(lVar22 + iVar14 / iVar12) = (undefined2)scratch.m_format.order;
            }
            iVar14 = iVar14 + iVar10;
          }
          uVar15 = local_750 + 1;
        }
      }
    }
  }
  glu::CallLogWrapper::glActiveTexture(&glLog,0x84c0);
  glu::CallLogWrapper::glBindTexture(&glLog,local_740,texture0.super_ObjectWrapper.m_object);
  setTexParameteri(&glLog,local_740);
  poVar1 = (ostringstream *)(color.m_data + 2);
  color.m_data._0_8_ = log;
  std::__cxx11::ostringstream::ostringstream(poVar1);
  std::operator<<((ostream *)poVar1,"// Filling texture ");
  std::ostream::_M_insert<unsigned_long>((ulong)poVar1);
  std::operator<<((ostream *)poVar1," with xor pattern");
  tcu::MessageBuilder::operator<<
            ((MessageBuilder *)&color,(EndMessageToken *)&tcu::TestLog::EndMessage);
  std::__cxx11::ostringstream::~ostringstream(poVar1);
  uploadTexture(&glLog,&reference,texture0Buf.super_ObjectWrapper.m_object);
  glu::CallLogWrapper::glActiveTexture(&glLog,0x84c1);
  glu::CallLogWrapper::glBindTexture(&glLog,local_740,texture1.super_ObjectWrapper.m_object);
  setTexParameteri(&glLog,local_740);
  imageSize_00 = &local_764;
  setTextureStorage(&glLog,pIVar19->m_textureType,dVar11,imageSize_00,
                    texture1Buf.super_ObjectWrapper.m_object);
  __rhs = glcts::fixed_sample_locations_values + 1;
  if (pIVar19->m_restrictImages != false) {
    __rhs = (bool *)0x18a6091;
  }
  getShaderImageFormatQualifier_abi_cxx11_(&shaderImageFormatStr,(Functional *)local_738,format_00);
  this_00 = (Functional *)(ulong)pIVar19->m_textureType;
  if (pIVar19->m_singleLayerBind == true) {
    if (pIVar19->m_textureType < TEXTURETYPE_LAST) {
      this_00 = (Functional *)(ulong)*(uint *)(&DAT_018a7cec + (long)this_00 * 4);
    }
    else {
      this_00 = (Functional *)0x8;
    }
  }
  CVar24 = (ChannelType)this_00;
  getShaderImageType_abi_cxx11_
            (&shaderImageTypeStr,(Functional *)(ulong)(pIVar19->m_imageFormat).type,CVar24,
             (TextureType)imageSize_00);
  pRVar6 = local_758;
  type.super_ApiType.m_bits = (ApiType)(*local_758->_vptr_RenderContext[2])(local_758);
  version = glu::getContextTypeGLSLVersion(type);
  pcVar13 = glu::getGLSLVersionDeclaration(version);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&glslVersionDeclaration,pcVar13,(allocator<char> *)&color);
  memset(&imageSize,0,0xac);
  local_1d0 = (pointer)0x0;
  uStack_1c8 = 0;
  uStack_1c7 = 0;
  uStack_1c0 = 0;
  uStack_1bf = 0;
  std::operator+(&local_4a0,&glslVersionDeclaration,"\n");
  textureTypeExtensionShaderRequires_abi_cxx11_
            (&local_4c0,this_00,(TextureType)pRVar6,(RenderContext *)imageSize_00);
  std::operator+(&local_480,&local_4a0,&local_4c0);
  std::operator+(&local_460,&local_480,"\nprecision highp ");
  std::operator+(&local_440,&local_460,&shaderImageTypeStr);
  std::operator+(&local_420,&local_440,
                 ";\n\nlayout (local_size_x = 1, local_size_y = 1, local_size_z = 1) in;\nlayout (")
  ;
  std::operator+(&local_400,&local_420,&shaderImageFormatStr);
  std::operator+(&local_3e0,&local_400,", binding=0) ");
  std::operator+(&local_3c0,&local_3e0,__rhs);
  std::operator+(&local_3a0,&local_3c0," readonly uniform ");
  std::operator+(&local_380,&local_3a0,&shaderImageTypeStr);
  std::operator+(&local_360,&local_380," u_image0;\nlayout (");
  std::operator+(&local_340,&local_360,&shaderImageFormatStr);
  std::operator+(&local_320,&local_340,", binding=1) ");
  std::operator+(&local_300,&local_320,__rhs);
  std::operator+(&local_2e0,&local_300," writeonly uniform ");
  std::operator+(&local_2c0,&local_2e0,&shaderImageTypeStr);
  std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_588,
                 &local_2c0," u_image1;\n\nvoid main (void)\n{\n");
  if (CVar24 == UNORM_BYTE_44) {
    local_5ec = local_764.m_data[0] - CUBEFACE_POSITIVE_X;
    de::toString<int>(&local_6d0,&local_5ec);
    std::operator+(&local_6f0,
                   "\tint pos = int(gl_GlobalInvocationID.x);\n\timageStore(u_image1, pos, imageLoad(u_image0, "
                   ,&local_6d0);
    std::operator+(&local_5e8,&local_6f0,"-pos));\n");
    bVar7 = false;
  }
  else {
    if (CVar24 - SNORM_INT16 < 3) {
      local_5f4 = local_764.m_data[0] - CUBEFACE_POSITIVE_X;
      de::toString<int>(&local_6d0,&local_5f4);
      std::operator+(&local_6f0,
                     "\tivec3 pos = ivec3(gl_GlobalInvocationID);\n\timageStore(u_image1, pos, imageLoad(u_image0, ivec3("
                     ,&local_6d0);
      std::operator+(&local_5e8,&local_6f0,"-pos.x, pos.y, pos.z)));\n");
      bVar26 = true;
      bVar7 = false;
      goto LAB_01254baf;
    }
    if (CVar24 != SNORM_INT8) {
      bVar7 = false;
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_5e8,(char *)0x0,(allocator<char> *)&local_6f0);
      bVar26 = false;
      goto LAB_01254baf;
    }
    local_5f0 = local_764.m_data[0] - CUBEFACE_POSITIVE_X;
    de::toString<int>(&local_6d0,&local_5f0);
    std::operator+(&local_6f0,
                   "\tivec2 pos = ivec2(gl_GlobalInvocationID.xy);\n\timageStore(u_image1, pos, imageLoad(u_image0, ivec2("
                   ,&local_6d0);
    std::operator+(&local_5e8,&local_6f0,"-pos.x, pos.y)));\n");
    bVar7 = true;
  }
  bVar26 = false;
LAB_01254baf:
  std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&sliceAccess_1
                 ,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_588,
                 &local_5e8);
  std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&scratchAccess
                 ,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                  &sliceAccess_1,"}\n");
  glu::ComputeSource::ComputeSource((ComputeSource *)&scratch,(string *)&scratchAccess);
  sources = glu::ProgramSources::operator<<((ProgramSources *)&imageSize,(ShaderSource *)&scratch);
  glu::ShaderProgram::ShaderProgram((ShaderProgram *)&color,local_758,sources);
  std::__cxx11::string::~string((string *)&scratch.m_size);
  std::__cxx11::string::~string((string *)&scratchAccess);
  std::__cxx11::string::~string((string *)&sliceAccess_1);
  std::__cxx11::string::~string((string *)&local_5e8);
  if (bVar26) {
    std::__cxx11::string::~string((string *)&local_6f0);
    std::__cxx11::string::~string((string *)&local_6d0);
  }
  CVar17 = local_730;
  pRVar6 = local_758;
  if (bVar7) {
    std::__cxx11::string::~string((string *)&local_6f0);
    std::__cxx11::string::~string((string *)&local_6d0);
  }
  if (CVar24 == UNORM_BYTE_44) {
    std::__cxx11::string::~string((string *)&local_6f0);
    std::__cxx11::string::~string((string *)&local_6d0);
  }
  std::__cxx11::string::~string((string *)local_588);
  std::__cxx11::string::~string((string *)&local_2c0);
  std::__cxx11::string::~string((string *)&local_2e0);
  std::__cxx11::string::~string((string *)&local_300);
  std::__cxx11::string::~string((string *)&local_320);
  std::__cxx11::string::~string((string *)&local_340);
  std::__cxx11::string::~string((string *)&local_360);
  std::__cxx11::string::~string((string *)&local_380);
  std::__cxx11::string::~string((string *)&local_3a0);
  std::__cxx11::string::~string((string *)&local_3c0);
  std::__cxx11::string::~string((string *)&local_3e0);
  std::__cxx11::string::~string((string *)&local_400);
  std::__cxx11::string::~string((string *)&local_420);
  std::__cxx11::string::~string((string *)&local_440);
  std::__cxx11::string::~string((string *)&local_460);
  std::__cxx11::string::~string((string *)&local_480);
  std::__cxx11::string::~string((string *)&local_4c0);
  std::__cxx11::string::~string((string *)&local_4a0);
  glu::ProgramSources::~ProgramSources((ProgramSources *)&imageSize);
  imageSize.m_data[0] = (*pRVar6->_vptr_RenderContext[3])(pRVar6);
  imageSize.m_data[1] = extraout_var_00;
  local_268[0]._M_impl.super__Rb_tree_header._M_header._M_left =
       &local_268[0]._M_impl.super__Rb_tree_header._M_header;
  local_268[0]._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  local_268[0]._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  local_268[0]._M_impl.super__Rb_tree_header._M_node_count = 0;
  unique0x10001e64 = log;
  local_268[0]._M_impl.super__Rb_tree_header._M_header._M_right =
       local_268[0]._M_impl.super__Rb_tree_header._M_header._M_left;
  glu::operator<<((TestLog *)log,(ShaderProgram *)&color);
  local_72c = CONCAT31(local_72c._1_3_,local_f0);
  if (local_f0 == false) {
    tcu::TestContext::setTestResult
              ((local_748->super_TestCase).super_TestCase.super_TestNode.m_testCtx,
               QP_TEST_RESULT_FAIL,"Program compilation failed");
  }
  else {
    glu::CallLogWrapper::glUseProgram(&glLog,local_118);
    if (local_748->m_singleLayerBind == true) {
      for (CVar17 = CUBEFACE_NEGATIVE_X; local_73c != CVar17; CVar17 = CVar17 + CUBEFACE_POSITIVE_X)
      {
        if (CVar17 != CUBEFACE_NEGATIVE_X) {
          glu::CallLogWrapper::glMemoryBarrier(&glLog,0x20);
        }
        glu::CallLogWrapper::glBindImageTexture
                  (&glLog,0,texture0.super_ObjectWrapper.m_object,0,'\0',CVar17,35000,format);
        iVar10 = (*local_758->_vptr_RenderContext[3])();
        dVar11 = (**(code **)(CONCAT44(extraout_var_01,iVar10) + 0x800))();
        glu::checkError(dVar11,"glBindImageTexture",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/gles31/functional/es31fShaderImageLoadStoreTests.cpp"
                        ,0x5c4);
        glu::CallLogWrapper::glBindImageTexture
                  (&glLog,1,texture1.super_ObjectWrapper.m_object,0,'\0',CVar17,0x88b9,format);
        iVar10 = (*local_758->_vptr_RenderContext[3])();
        dVar11 = (**(code **)(CONCAT44(extraout_var_02,iVar10) + 0x800))();
        glu::checkError(dVar11,"glBindImageTexture",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/gles31/functional/es31fShaderImageLoadStoreTests.cpp"
                        ,0x5c7);
        glu::CallLogWrapper::glDispatchCompute(&glLog,local_764.m_data[0],local_764.m_data[1],1);
        iVar10 = (*local_758->_vptr_RenderContext[3])();
        dVar11 = (**(code **)(CONCAT44(extraout_var_03,iVar10) + 0x800))();
        glu::checkError(dVar11,"glDispatchCompute",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/gles31/functional/es31fShaderImageLoadStoreTests.cpp"
                        ,0x5ca);
      }
    }
    else {
      glu::CallLogWrapper::glBindImageTexture
                (&glLog,0,texture0.super_ObjectWrapper.m_object,0,'\x01',0,35000,format);
      iVar10 = (*local_758->_vptr_RenderContext[3])();
      dVar11 = (**(code **)(CONCAT44(extraout_var_04,iVar10) + 0x800))();
      glu::checkError(dVar11,"glBindImageTexture",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/gles31/functional/es31fShaderImageLoadStoreTests.cpp"
                      ,0x5d0);
      glu::CallLogWrapper::glBindImageTexture
                (&glLog,1,texture1.super_ObjectWrapper.m_object,0,'\x01',0,0x88b9,format);
      iVar10 = (*local_758->_vptr_RenderContext[3])();
      dVar11 = (**(code **)(CONCAT44(extraout_var_05,iVar10) + 0x800))();
      glu::checkError(dVar11,"glBindImageTexture",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/gles31/functional/es31fShaderImageLoadStoreTests.cpp"
                      ,0x5d3);
      glu::CallLogWrapper::glDispatchCompute(&glLog,local_764.m_data[0],local_764.m_data[1],CVar17);
      iVar10 = (*local_758->_vptr_RenderContext[3])();
      dVar11 = (**(code **)(CONCAT44(extraout_var_06,iVar10) + 0x800))();
      glu::checkError(dVar11,"glDispatchCompute",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/gles31/functional/es31fShaderImageLoadStoreTests.cpp"
                      ,0x5d6);
    }
    pTVar20 = local_738;
    pIVar19 = local_748;
    if (((local_748->m_textureFormat).order != (local_748->m_imageFormat).order) ||
       ((local_748->m_textureFormat).type != (local_748->m_imageFormat).type)) {
      iVar10 = tcu::TextureFormat::getPixelSize(local_738);
      tcu::TextureLevel::TextureLevel(&scratch,pTVar20,1,1,1);
      tcu::TextureLevel::getAccess(&scratchAccess,&scratch);
      for (CVar17 = CUBEFACE_NEGATIVE_X; CVar17 != local_73c; CVar17 = CVar17 + CUBEFACE_POSITIVE_X)
      {
        if (pIVar19->m_textureType == TEXTURETYPE_CUBE) {
          LayeredImage::getCubeFaceAccessInternal(&sliceAccess_1,&reference,CVar17);
        }
        else {
          LayeredImage::getSliceAccessInternal(&sliceAccess_1,&reference,CVar17);
        }
        local_728 = CONCAT44(local_728._4_4_,
                             sliceAccess_1.super_ConstPixelBufferAccess.m_pitch.m_data[1]);
        local_738 = (TextureFormat *)sliceAccess_1.super_ConstPixelBufferAccess.m_data;
        uVar15 = 0;
        while (pTVar20 = local_738, (long)uVar15 < (long)local_764.m_data[1]) {
          iVar12 = (CubeFace)local_728 * (int)uVar15;
          iVar18 = 0;
          local_750 = uVar15;
          for (lVar21 = 0; lVar21 < local_764.m_data[0]; lVar21 = lVar21 + 1) {
            __src = (void *)((long)&pTVar20->order + (long)iVar18 + (long)iVar12);
            memcpy(scratchAccess.super_ConstPixelBufferAccess.m_data,__src,(long)iVar10);
            CVar24 = (local_748->m_imageFormat).type;
            if ((((ulong)CVar24 < 0x22) && ((0x2c0000000U >> ((ulong)CVar24 & 0x3f) & 1) != 0)) ||
               (CVar24 - SIGNED_INT8 < 3)) {
              tcu::ConstPixelBufferAccess::getPixelUint
                        ((ConstPixelBufferAccess *)local_588,(int)&scratchAccess,0,0);
              tcu::PixelBufferAccess::setPixel(&scratchAccess,(UVec4 *)local_588,0,0,0);
            }
            else {
              tcu::ConstPixelBufferAccess::getPixel
                        ((ConstPixelBufferAccess *)local_588,(int)&scratchAccess,0,0);
              tcu::PixelBufferAccess::setPixel(&scratchAccess,(Vec4 *)local_588,0,0,0);
            }
            memcpy(__src,scratchAccess.super_ConstPixelBufferAccess.m_data,(long)iVar10);
            iVar18 = iVar18 + iVar10;
          }
          pIVar19 = local_748;
          uVar15 = local_750 + 1;
        }
      }
      tcu::TextureLevel::~TextureLevel(&scratch);
    }
    for (CVar17 = CUBEFACE_NEGATIVE_X; CVar17 != local_73c; CVar17 = CVar17 + CUBEFACE_POSITIVE_X) {
      for (iVar10 = 0; iVar10 < local_764.m_data[1]; iVar10 = iVar10 + 1) {
        iVar12 = -1;
        local_750 = CONCAT44(local_750._4_4_,iVar10);
        for (iVar18 = 0; iVar18 < local_764.m_data[0] / 2; iVar18 = iVar18 + 1) {
          iVar14 = (int)&reference;
          if (bVar25) {
            LayeredImage::getPixelUint
                      ((LayeredImage *)&scratch,iVar14,local_764.m_data[0] + iVar12,iVar10);
            iVar9 = local_764.m_data[0];
            LayeredImage::getPixelUint((LayeredImage *)&scratchAccess,iVar14,iVar18,iVar10);
            Functional::(anonymous_namespace)::LayeredImage::setPixel<tcu::Vector<unsigned_int,4>>
                      ((LayeredImage *)&reference,iVar9 + iVar12,iVar10,CVar17,
                       (Vector<unsigned_int,_4> *)&scratchAccess);
            Functional::(anonymous_namespace)::LayeredImage::setPixel<tcu::Vector<unsigned_int,4>>
                      ((LayeredImage *)&reference,iVar18,iVar10,CVar17,
                       (Vector<unsigned_int,_4> *)&scratch);
          }
          else {
            LayeredImage::getPixel
                      ((LayeredImage *)&scratch,iVar14,local_764.m_data[0] + iVar12,iVar10);
            iVar9 = local_764.m_data[0];
            LayeredImage::getPixel((LayeredImage *)&scratchAccess,iVar14,iVar18,iVar10);
            Functional::(anonymous_namespace)::LayeredImage::setPixel<tcu::Vector<float,4>>
                      ((LayeredImage *)&reference,iVar9 + iVar12,iVar10,CVar17,
                       (Vector<float,_4> *)&scratchAccess);
            Functional::(anonymous_namespace)::LayeredImage::setPixel<tcu::Vector<float,4>>
                      ((LayeredImage *)&reference,iVar18,iVar10,CVar17,(Vector<float,_4> *)&scratch)
            ;
          }
          iVar12 = iVar12 + -1;
          iVar10 = (int)(float)local_750;
        }
      }
    }
  }
  std::
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>_>
  ::~_Rb_tree(local_268);
  glu::ShaderProgram::~ShaderProgram((ShaderProgram *)&color);
  std::__cxx11::string::~string((string *)&glslVersionDeclaration);
  std::__cxx11::string::~string((string *)&shaderImageTypeStr);
  std::__cxx11::string::~string((string *)&shaderImageFormatStr);
  pIVar19 = local_748;
  if ((char)local_72c != '\0') {
    TVar3 = local_748->m_textureType;
    imageSize.m_data[0] = 0;
    imageSize.m_data[1] = 0;
    ImageLayerComparer::ImageLayerComparer
              ((ImageLayerComparer *)&color,&reference,(IVec2 *)&imageSize);
    bVar25 = readTextureAndVerify
                       (local_758,&glLog,texture1.super_ObjectWrapper.m_object,
                        texture1Buf.super_ObjectWrapper.m_object,TVar3,&this->m_textureFormat,
                        &local_764,(ImageLayerVerifier *)&color);
    pcVar13 = "Image comparison failed";
    if (bVar25) {
      pcVar13 = "Pass";
    }
    tcu::TestContext::setTestResult
              ((pIVar19->super_TestCase).super_TestCase.super_TestNode.m_testCtx,(uint)!bVar25,
               pcVar13);
  }
  LayeredImage::~LayeredImage(&reference);
  glu::ObjectWrapper::~ObjectWrapper(&texture1.super_ObjectWrapper);
  glu::ObjectWrapper::~ObjectWrapper(&texture0.super_ObjectWrapper);
  glu::ObjectWrapper::~ObjectWrapper(&texture1Buf.super_ObjectWrapper);
  glu::ObjectWrapper::~ObjectWrapper(&texture0Buf.super_ObjectWrapper);
  glu::CallLogWrapper::~CallLogWrapper(&glLog);
  return STOP;
}

Assistant:

ImageLoadAndStoreCase::IterateResult ImageLoadAndStoreCase::iterate (void)
{
	const RenderContext&		renderCtx					= m_context.getRenderContext();
	TestLog&					log							(m_testCtx.getLog());
	glu::CallLogWrapper			glLog						(renderCtx.getFunctions(), log);
	const deUint32				textureInternalFormatGL		= glu::getInternalFormat(m_textureFormat);
	const deUint32				imageInternalFormatGL		= glu::getInternalFormat(m_imageFormat);
	const deUint32				textureTargetGL				= getGLTextureTarget(m_textureType);
	const IVec3&				imageSize					= defaultImageSize(m_textureType);
	const int					maxImageDimension			= de::max(imageSize.x(), de::max(imageSize.y(), imageSize.z()));
	const float					storeColorScale				= isFormatTypeUnorm(m_textureFormat.type) ? 1.0f / (float)(maxImageDimension - 1)
															: isFormatTypeSnorm(m_textureFormat.type) ? 2.0f / (float)(maxImageDimension - 1)
															: 1.0f;
	const float					storeColorBias				= isFormatTypeSnorm(m_textureFormat.type) ? -1.0f : 0.0f;
	const int					numSlicesOrFaces			= m_textureType == TEXTURETYPE_CUBE ? 6 : imageSize.z();
	const bool					isIntegerTextureFormat		= isFormatTypeInteger(m_textureFormat.type);
	const glu::Buffer			texture0Buf					(renderCtx);
	const glu::Buffer			texture1Buf					(renderCtx);
	const glu::Texture			texture0					(renderCtx);
	const glu::Texture			texture1					(renderCtx);
	LayeredImage				reference					(m_textureType, m_textureFormat, imageSize.x(), imageSize.y(), imageSize.z());

	glLog.enableLogging(true);

	// Setup textures.

	log << TestLog::Message << "// Created 2 textures (names " << *texture0 << " and " << *texture1 << ")" << TestLog::EndMessage;
	if (m_textureType == TEXTURETYPE_BUFFER)
		log << TestLog::Message << "// Created buffers for the textures (names " << *texture0Buf << " and " << *texture1Buf << ")" << TestLog::EndMessage;

	// First, fill reference with (a fairly arbitrary) initial pattern. This will be used as texture upload source data as well as for actual reference computation later on.

	DE_ASSERT(!isIntegerTextureFormat || (storeColorScale == 1.0f && storeColorBias == 0.0f));

	for (int z = 0; z < numSlicesOrFaces; z++)
	for (int y = 0; y < imageSize.y(); y++)
	for (int x = 0; x < imageSize.x(); x++)
	{
		const IVec4 color(x^y^z, (imageSize.x()-1-x)^y^z, x^(imageSize.y()-1-y)^z, (imageSize.x()-1-x)^(imageSize.y()-1-y)^z);

		if (isIntegerTextureFormat)
			reference.setPixel(x, y, z, color);
		else
			reference.setPixel(x, y, z, color.asFloat()*storeColorScale + storeColorBias);
	}

	// If re-interpreting the texture contents as floating point values, need to get rid of inf, nan etc.
	if (m_imageFormat.type == TextureFormat::HALF_FLOAT && m_textureFormat.type != TextureFormat::HALF_FLOAT)
		replaceBadFloatReinterpretValues<TextureFormat::HALF_FLOAT, tcu::Float16, deUint16>(reference, m_imageFormat);
	else if (m_imageFormat.type == TextureFormat::FLOAT && m_textureFormat.type != TextureFormat::FLOAT)
		replaceBadFloatReinterpretValues<TextureFormat::FLOAT, tcu::Float32, deUint32>(reference, m_imageFormat);

	// Upload initial pattern to texture 0.

	glLog.glActiveTexture(GL_TEXTURE0);
	glLog.glBindTexture(textureTargetGL, *texture0);
	setTexParameteri(glLog, textureTargetGL);

	log << TestLog::Message << "// Filling texture " << *texture0 << " with xor pattern" << TestLog::EndMessage;

	uploadTexture(glLog, reference, *texture0Buf);

	// Set storage for texture 1.

	glLog.glActiveTexture(GL_TEXTURE1);
	glLog.glBindTexture(textureTargetGL, *texture1);
	setTexParameteri(glLog, textureTargetGL);
	setTextureStorage(glLog, m_textureType, textureInternalFormatGL, imageSize, *texture1Buf);

	// Perform image loads and stores in compute shader and finalize reference computation.

	{
		// Generate compute shader.

		const char* const		maybeRestrict			= m_restrictImages ? "restrict" : "";
		const string			shaderImageFormatStr	= getShaderImageFormatQualifier(m_imageFormat);
		const TextureType		shaderImageType			= m_singleLayerBind ? textureLayerType(m_textureType) : m_textureType;
		const string			shaderImageTypeStr		= getShaderImageType(m_imageFormat.type, shaderImageType);
		const std::string		glslVersionDeclaration	= glu::getGLSLVersionDeclaration(glu::getContextTypeGLSLVersion(renderCtx.getType()));

		const glu::ShaderProgram program(renderCtx,
			glu::ProgramSources() << glu::ComputeSource(glslVersionDeclaration + "\n"
														+ textureTypeExtensionShaderRequires(shaderImageType, renderCtx) +
														"\n"
														"precision highp " + shaderImageTypeStr + ";\n"
														"\n"
														"layout (local_size_x = 1, local_size_y = 1, local_size_z = 1) in;\n"
														"layout (" + shaderImageFormatStr + ", binding=0) " + maybeRestrict + " readonly uniform " + shaderImageTypeStr + " u_image0;\n"
														"layout (" + shaderImageFormatStr + ", binding=1) " + maybeRestrict + " writeonly uniform " + shaderImageTypeStr + " u_image1;\n"
														"\n"
														"void main (void)\n"
														"{\n"
														+ (shaderImageType == TEXTURETYPE_BUFFER ?
															"	int pos = int(gl_GlobalInvocationID.x);\n"
															"	imageStore(u_image1, pos, imageLoad(u_image0, " + toString(imageSize.x()-1) + "-pos));\n"
														 : shaderImageType == TEXTURETYPE_2D ?
															"	ivec2 pos = ivec2(gl_GlobalInvocationID.xy);\n"
															"	imageStore(u_image1, pos, imageLoad(u_image0, ivec2(" + toString(imageSize.x()-1) + "-pos.x, pos.y)));\n"
														 : shaderImageType == TEXTURETYPE_3D || shaderImageType == TEXTURETYPE_CUBE || shaderImageType == TEXTURETYPE_2D_ARRAY ?
															"	ivec3 pos = ivec3(gl_GlobalInvocationID);\n"
															"	imageStore(u_image1, pos, imageLoad(u_image0, ivec3(" + toString(imageSize.x()-1) + "-pos.x, pos.y, pos.z)));\n"
														 : DE_NULL) +
														"}\n"));

		UniformAccessLogger uniforms(renderCtx.getFunctions(), log, program.getProgram());

		log << program;

		if (!program.isOk())
		{
			m_testCtx.setTestResult(QP_TEST_RESULT_FAIL, "Program compilation failed");
			return STOP;
		}

		// Setup and dispatch.

		glLog.glUseProgram(program.getProgram());

		if (m_singleLayerBind)
		{
			for (int layerNdx = 0; layerNdx < numSlicesOrFaces; layerNdx++)
			{
				if (layerNdx > 0)
					glLog.glMemoryBarrier(GL_SHADER_IMAGE_ACCESS_BARRIER_BIT);

				glLog.glBindImageTexture(0, *texture0, 0, GL_FALSE, layerNdx, GL_READ_ONLY, imageInternalFormatGL);
				GLU_EXPECT_NO_ERROR(renderCtx.getFunctions().getError(), "glBindImageTexture");

				glLog.glBindImageTexture(1, *texture1, 0, GL_FALSE, layerNdx, GL_WRITE_ONLY, imageInternalFormatGL);
				GLU_EXPECT_NO_ERROR(renderCtx.getFunctions().getError(), "glBindImageTexture");

				glLog.glDispatchCompute(imageSize.x(), imageSize.y(), 1);
				GLU_EXPECT_NO_ERROR(renderCtx.getFunctions().getError(), "glDispatchCompute");
			}
		}
		else
		{
			glLog.glBindImageTexture(0, *texture0, 0, GL_TRUE, 0, GL_READ_ONLY, imageInternalFormatGL);
			GLU_EXPECT_NO_ERROR(renderCtx.getFunctions().getError(), "glBindImageTexture");

			glLog.glBindImageTexture(1, *texture1, 0, GL_TRUE, 0, GL_WRITE_ONLY, imageInternalFormatGL);
			GLU_EXPECT_NO_ERROR(renderCtx.getFunctions().getError(), "glBindImageTexture");

			glLog.glDispatchCompute(imageSize.x(), imageSize.y(), numSlicesOrFaces);
			GLU_EXPECT_NO_ERROR(renderCtx.getFunctions().getError(), "glDispatchCompute");
		}

		// Finalize reference.

		if (m_textureFormat != m_imageFormat)
		{
			// Format re-interpretation case. Read data with image format and write back, with the same image format.
			// We do this because the data may change a little during lookups (e.g. unorm8 -> float; not all unorms can be exactly represented as floats).

			const int					pixelSize		= m_imageFormat.getPixelSize();
			tcu::TextureLevel			scratch			(m_imageFormat, 1, 1);
			const PixelBufferAccess		scratchAccess	= scratch.getAccess();

			for (int z = 0; z < numSlicesOrFaces; z++)
			{
				const PixelBufferAccess		sliceAccess		= m_textureType == TEXTURETYPE_CUBE ? reference.getCubeFaceAccess((tcu::CubeFace)z) : reference.getSliceAccess(z);
				const int					rowPitch		= sliceAccess.getRowPitch();
				void *const					data			= sliceAccess.getDataPtr();

				for (int y = 0; y < imageSize.y(); y++)
				for (int x = 0; x < imageSize.x(); x++)
				{
					void *const pixelData = (deUint8*)data + y*rowPitch + x*pixelSize;

					deMemcpy(scratchAccess.getDataPtr(), pixelData, pixelSize);

					if (isFormatTypeInteger(m_imageFormat.type))
						scratchAccess.setPixel(scratchAccess.getPixelUint(0, 0), 0, 0);
					else
						scratchAccess.setPixel(scratchAccess.getPixel(0, 0), 0, 0);

					deMemcpy(pixelData, scratchAccess.getDataPtr(), pixelSize);
				}
			}
		}

		for (int z = 0; z < numSlicesOrFaces; z++)
		for (int y = 0; y < imageSize.y(); y++)
		for (int x = 0; x < imageSize.x()/2; x++)
		{
			if (isIntegerTextureFormat)
			{
				const UVec4 temp = reference.getPixelUint(imageSize.x()-1-x, y, z);
				reference.setPixel(imageSize.x()-1-x, y, z, reference.getPixelUint(x, y, z));
				reference.setPixel(x, y, z, temp);
			}
			else
			{
				const Vec4 temp = reference.getPixel(imageSize.x()-1-x, y, z);
				reference.setPixel(imageSize.x()-1-x, y, z, reference.getPixel(x, y, z));
				reference.setPixel(x, y, z, temp);
			}
		}
	}

	// Read texture 1 and compare to reference.

	const bool compareOk = readTextureAndVerify(renderCtx, glLog, *texture1, *texture1Buf, m_textureType, m_textureFormat, imageSize, ImageLayerComparer(reference));

	m_testCtx.setTestResult(compareOk ? QP_TEST_RESULT_PASS : QP_TEST_RESULT_FAIL, compareOk ? "Pass" : "Image comparison failed");
	return STOP;
}